

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

int baryonyx::itm::
    compute_violated_constraints<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>,baryonyx::bit_array>
              (solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
               *slv,bit_array *x,vector<int,_std::allocator<int>_> *out)

{
  bool bVar1;
  int iVar2;
  int local_24;
  vector<int,std::allocator<int>> *pvStack_20;
  int k;
  vector<int,_std::allocator<int>_> *out_local;
  bit_array *x_local;
  solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
  *slv_local;
  
  pvStack_20 = (vector<int,std::allocator<int>> *)out;
  out_local = (vector<int,_std::allocator<int>_> *)x;
  x_local = (bit_array *)slv;
  std::vector<int,_std::allocator<int>_>::clear(out);
  for (local_24 = 0;
      local_24 !=
      *(int *)&x_local[7].super_bit_array_impl.m_data._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl; local_24 = local_24 + 1)
  {
    bVar1 = is_valid_constraint<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>,baryonyx::bit_array>
                      ((solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
                        *)x_local,local_24,(bit_array *)out_local);
    if (!bVar1) {
      std::vector<int,std::allocator<int>>::emplace_back<int&>(pvStack_20,&local_24);
    }
  }
  iVar2 = length<std::vector<int,std::allocator<int>>>
                    ((vector<int,_std::allocator<int>_> *)pvStack_20);
  return iVar2;
}

Assistant:

int
compute_violated_constraints(const Solver& slv,
                             const Xtype& x,
                             std::vector<int>& out)
{
    out.clear();

    for (int k = 0; k != slv.m; ++k)
        if (!is_valid_constraint(slv, k, x))
            out.emplace_back(k);

    return length(out);
}